

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArYieldResult * __thiscall
NEST::LArNEST::GetLeptonLETYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double dx,
          double efield,double density)

{
  double dVar1;
  LArNEST *this_00;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double LET;
  
  this_00 = this;
  dVar3 = GetCanonicalIonizationYields(this,energy);
  dVar1 = this->fNexOverNion;
  LET = (double)(-(ulong)(dx != 0.0) & (ulong)((1.0 / density) * (energy / dx)));
  if (((0.0 < dx) && (0.0 < energy)) && (0.0 < LET)) {
    dVar4 = GetLinearEnergyTransfer(this_00,energy * 1000.0,false);
    uVar2 = -(ulong)(dVar4 / LET < 0.7);
    LET = (double)(~uVar2 & (ulong)LET | (ulong)(LET * (dVar4 / LET)) & uVar2);
  }
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  GetLETRecombinationYields(__return_storage_ptr__,this,dVar4,dVar1 * dVar4,energy,LET,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetLeptonLETYields(double energy, double dx,
                                           double efield, double density) {
  LArYieldResult result;
  double ionization_yields = GetCanonicalIonizationYields(energy);
  if (ionization_yields < 0.0) {
    ionization_yields = 0.0;
  }
  double exciton_yields = fNexOverNion * ionization_yields;
  double LET = 0.0;
  if (dx) {
    LET = (energy / dx) * (1 / density);  // lin. energy xfer (prop. to dE/dx)
  }
  if (LET > 0 && energy > 0 && dx > 0) {
    double ratio = GetLinearEnergyTransfer(energy * 1e3) / LET;
    if (ratio < 0.7) {
      dx /= ratio;
      LET *= ratio;
    }
  }
  return GetLETRecombinationYields(ionization_yields, exciton_yields, energy,
                                   LET, efield);
}